

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

void nsvg__parseStyle(NSVGparser *p,char *str)

{
  char *start_00;
  int iVar1;
  bool bVar2;
  char *local_28;
  char *end;
  char *start;
  char *str_local;
  NSVGparser *p_local;
  
  start = str;
  while (*start != '\0') {
    while( true ) {
      start_00 = start;
      bVar2 = false;
      if (*start != '\0') {
        iVar1 = nsvg__isspace(*start);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      start = start + 1;
    }
    while( true ) {
      bVar2 = false;
      if (*start != '\0') {
        bVar2 = *start != ';';
      }
      if (!bVar2) break;
      start = start + 1;
    }
    local_28 = start;
    while( true ) {
      bVar2 = false;
      if ((start_00 < local_28) && (bVar2 = true, *local_28 != ';')) {
        iVar1 = nsvg__isspace(*local_28);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      local_28 = local_28 + -1;
    }
    nsvg__parseNameValue(p,start_00,local_28 + 1);
    if (*start != '\0') {
      start = start + 1;
    }
  }
  return;
}

Assistant:

static void nsvg__parseStyle(NSVGparser* p, const char* str)
{
	const char* start;
	const char* end;

	while (*str) {
		// Left Trim
		while(*str && nsvg__isspace(*str)) ++str;
		start = str;
		while(*str && *str != ';') ++str;
		end = str;

		// Right Trim
		while (end > start &&  (*end == ';' || nsvg__isspace(*end))) --end;
		++end;

		nsvg__parseNameValue(p, start, end);
		if (*str) ++str;
	}
}